

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall Gecko::Graph::swap(Graph *this,uint k,uint l)

{
  uint uVar1;
  uint uVar2;
  reference puVar3;
  reference pNVar4;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  bool bVar5;
  Float p;
  Index i;
  float local_18;
  uint local_c;
  
  puVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                      (ulong)in_ESI);
  uVar1 = *puVar3;
  puVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                      (ulong)in_EDX);
  uVar2 = *puVar3;
  puVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                      (ulong)in_ESI);
  *puVar3 = uVar2;
  puVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                      (ulong)in_EDX);
  *puVar3 = uVar1;
  pNVar4 = std::vector<Gecko::Node,_std::allocator<Gecko::Node>_>::operator[]
                     ((vector<Gecko::Node,_std::allocator<Gecko::Node>_> *)(in_RDI + 0x28),
                      (ulong)uVar1);
  local_18 = pNVar4->pos;
  pNVar4 = std::vector<Gecko::Node,_std::allocator<Gecko::Node>_>::operator[]
                     ((vector<Gecko::Node,_std::allocator<Gecko::Node>_> *)(in_RDI + 0x28),
                      (ulong)uVar1);
  local_18 = local_18 - pNVar4->hlen;
  local_c = in_ESI;
  do {
    puVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x10),
                        (ulong)local_c);
    uVar1 = *puVar3;
    pNVar4 = std::vector<Gecko::Node,_std::allocator<Gecko::Node>_>::operator[]
                       ((vector<Gecko::Node,_std::allocator<Gecko::Node>_> *)(in_RDI + 0x28),
                        (ulong)uVar1);
    local_18 = pNVar4->hlen + local_18;
    pNVar4 = std::vector<Gecko::Node,_std::allocator<Gecko::Node>_>::operator[]
                       ((vector<Gecko::Node,_std::allocator<Gecko::Node>_> *)(in_RDI + 0x28),
                        (ulong)uVar1);
    pNVar4->pos = local_18;
    pNVar4 = std::vector<Gecko::Node,_std::allocator<Gecko::Node>_>::operator[]
                       ((vector<Gecko::Node,_std::allocator<Gecko::Node>_> *)(in_RDI + 0x28),
                        (ulong)uVar1);
    local_18 = pNVar4->hlen + local_18;
    bVar5 = local_c != in_EDX;
    local_c = local_c + 1;
  } while (bVar5);
  return;
}

Assistant:

void
Graph::swap(uint k, uint l)
{
  Node::Index i = perm[k];
  perm[k] = perm[l];
  perm[l] = i;
  Float p = node[i].pos - node[i].hlen;
  do {
    i = perm[k];
    p += node[i].hlen;
    node[i].pos = p;
    p += node[i].hlen;
  } while (k++ != l);
}